

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O0

void __thiscall Pl_PNGFilter::encodeRow(Pl_PNGFilter *this)

{
  Pipeline *pPVar1;
  uint local_18;
  char local_11;
  uint i;
  uchar ch;
  Pl_PNGFilter *this_local;
  
  local_11 = '\x02';
  _i = this;
  pPVar1 = Pipeline::next(&this->super_Pipeline);
  (*pPVar1->_vptr_Pipeline[2])(pPVar1,&local_11,1);
  if (this->prev_row == (uchar *)0x0) {
    pPVar1 = Pipeline::next(&this->super_Pipeline);
    (*pPVar1->_vptr_Pipeline[2])(pPVar1,this->cur_row,(ulong)this->bytes_per_row);
  }
  else {
    for (local_18 = 0; local_18 < this->bytes_per_row; local_18 = local_18 + 1) {
      local_11 = this->cur_row[local_18] - this->prev_row[local_18];
      pPVar1 = Pipeline::next(&this->super_Pipeline);
      (*pPVar1->_vptr_Pipeline[2])(pPVar1,&local_11,1);
    }
  }
  return;
}

Assistant:

void
Pl_PNGFilter::encodeRow()
{
    // For now, hard-code to using UP filter.
    unsigned char ch = 2;
    next()->write(&ch, 1);
    if (this->prev_row) {
        for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
            ch = static_cast<unsigned char>(this->cur_row[i] - this->prev_row[i]);
            next()->write(&ch, 1);
        }
    } else {
        next()->write(this->cur_row, this->bytes_per_row);
    }
}